

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

int get_attack_number(CHAR_DATA *ch,int dt)

{
  int in_ESI;
  CHAR_DATA *in_RDI;
  int tmp_dt;
  OBJ_DATA *wield;
  int local_24;
  OBJ_DATA *local_20;
  int local_4;
  
  if (in_ESI == gsn_dual_wield) {
    local_20 = get_eq_char(in_RDI,0x12);
  }
  else {
    local_20 = get_eq_char(in_RDI,0x10);
  }
  if (local_20 == (OBJ_DATA *)0x0) {
    local_4 = (int)in_RDI->dam_type;
  }
  else {
    local_4 = local_20->value[3];
  }
  local_24 = local_4 + 1000;
  if ((local_24 < 0x3e9) || (0x425 < local_24)) {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int get_attack_number(CHAR_DATA *ch, int dt)
{
	OBJ_DATA *wield;
	int tmp_dt;

	/*
		if(is_shifted(ch))
			return attack_lookup(form_table[ch->pcdata->shifted].attack_type);
	*/

	tmp_dt = TYPE_HIT;

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	else
		wield = get_eq_char(ch, WEAR_WIELD);

	if (wield != nullptr)
		tmp_dt += wield->value[3];
	else
		tmp_dt += ch->dam_type;

	if (tmp_dt > TYPE_HIT && tmp_dt < TYPE_HIT + MAX_DAMAGE_MESSAGE)
		return (tmp_dt - TYPE_HIT);

	return 1;
}